

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O3

int mbedtls_pk_write_key_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  void *pvVar1;
  mbedtls_ecp_keypair *ec;
  mbedtls_pk_type_t mVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  size_t sVar11;
  uchar *c;
  uchar *local_50;
  uint local_44;
  ulong local_40;
  uint local_34;
  
  local_50 = buf + size;
  mVar2 = mbedtls_pk_get_type(key);
  if (mVar2 == MBEDTLS_PK_RSA) {
    pvVar1 = key->pk_ctx;
    iVar3 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0xb8));
    if (iVar3 < 0) {
      return iVar3;
    }
    iVar4 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0xa0));
    if (iVar4 < 0) {
      return iVar4;
    }
    uVar5 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0x88));
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    uVar6 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0x70));
    if ((int)uVar6 < 0) {
      return uVar6;
    }
    iVar7 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0x58));
    if (iVar7 < 0) {
      return iVar7;
    }
    local_40 = CONCAT44(local_40._4_4_,iVar7);
    local_44 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0x40));
    if ((int)local_44 < 0) {
      return local_44;
    }
    local_34 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0x28));
    if ((int)local_34 < 0) {
      return local_34;
    }
    uVar8 = mbedtls_asn1_write_mpi(&local_50,buf,(mbedtls_mpi *)((long)pvVar1 + 0x10));
    if ((int)uVar8 < 0) {
      return uVar8;
    }
    uVar9 = mbedtls_asn1_write_int(&local_50,buf,0);
    if ((int)uVar9 < 0) {
      return uVar9;
    }
    sVar11 = (ulong)uVar9 +
             (ulong)uVar8 + (ulong)local_34 + (ulong)local_44 +
             (local_40 & 0xffffffff) + (ulong)uVar6 + (ulong)uVar5 + (ulong)(uint)(iVar4 + iVar3);
  }
  else {
    mVar2 = mbedtls_pk_get_type(key);
    if (mVar2 != MBEDTLS_PK_ECKEY) {
      return -0x3980;
    }
    ec = (mbedtls_ecp_keypair *)key->pk_ctx;
    iVar3 = pk_write_ec_pubkey(&local_50,buf,ec);
    if (iVar3 < 0) {
      return iVar3;
    }
    if (local_50 == buf || (long)local_50 - (long)buf < 0) {
      return -0x6c;
    }
    local_50[-1] = '\0';
    local_50 = local_50 + -1;
    uVar5 = mbedtls_asn1_write_len(&local_50,buf,(ulong)(iVar3 + 1));
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    uVar6 = mbedtls_asn1_write_tag(&local_50,buf,'\x03');
    if ((int)uVar6 < 0) {
      return uVar6;
    }
    sVar11 = (ulong)(iVar3 + 1) + (ulong)uVar6 + (ulong)uVar5;
    uVar5 = mbedtls_asn1_write_len(&local_50,buf,sVar11);
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    uVar6 = mbedtls_asn1_write_tag(&local_50,buf,0xa1);
    if ((int)uVar6 < 0) {
      return uVar6;
    }
    uVar8 = pk_write_ec_param(&local_50,buf,(mbedtls_ecp_keypair *)(ulong)(ec->grp).id);
    if ((int)uVar8 < 0) {
      return uVar8;
    }
    iVar3 = mbedtls_asn1_write_len(&local_50,buf,(ulong)uVar8);
    local_40 = CONCAT44(extraout_var,iVar3);
    if (iVar3 < 0) {
      return iVar3;
    }
    local_44 = mbedtls_asn1_write_tag(&local_50,buf,0xa0);
    if ((int)local_44 < 0) {
      return local_44;
    }
    uVar9 = mbedtls_asn1_write_mpi(&local_50,buf,&ec->d);
    if ((int)uVar9 < 0) {
      return uVar9;
    }
    *local_50 = '\x04';
    uVar10 = mbedtls_asn1_write_int(&local_50,buf,1);
    if ((int)uVar10 < 0) {
      return uVar10;
    }
    sVar11 = sVar11 + uVar5 + (ulong)uVar6 + (ulong)((int)local_40 + uVar8) +
             (ulong)uVar10 + (ulong)uVar9 + (ulong)local_44;
  }
  iVar4 = mbedtls_asn1_write_len(&local_50,buf,sVar11);
  iVar3 = iVar4;
  if ((-1 < iVar4) && (iVar3 = mbedtls_asn1_write_tag(&local_50,buf,'0'), -1 < iVar3)) {
    iVar3 = (int)sVar11 + iVar3 + iVar4;
  }
  return iVar3;
}

Assistant:

int mbedtls_pk_write_key_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char *c = buf + size;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( *key );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->QP ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->DQ ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->DP ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->Q ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->P ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->D ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->E ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->N ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 0 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ec = mbedtls_pk_ec( *key );
        size_t pub_len = 0, par_len = 0;

        /*
         * RFC 5915, or SEC1 Appendix C.4
         *
         * ECPrivateKey ::= SEQUENCE {
         *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
         *      privateKey     OCTET STRING,
         *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
         *      publicKey  [1] BIT STRING OPTIONAL
         *    }
         */

        /* publicKey */
        MBEDTLS_ASN1_CHK_ADD( pub_len, pk_write_ec_pubkey( &c, buf, ec ) );

        if( c - buf < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--c = 0;
        pub_len += 1;

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) );
        len += pub_len;

        /* parameters */
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, ec ) );

        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_len( &c, buf, par_len ) );
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) );
        len += par_len;

        /* privateKey: write as MPI then fix tag */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &ec->d ) );
        *c = MBEDTLS_ASN1_OCTET_STRING;

        /* version */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 1 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}